

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_update.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::BindUpdateSet
          (Binder *this,LogicalOperator *op,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root,UpdateSetInfo *set_info,TableCatalogEntry *table,
          vector<duckdb::PhysicalIndex,_true> *columns)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  _func_int **pp_Var4;
  reference name;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  ColumnDefinition *this_00;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  _Var5;
  pointer pPVar6;
  LogicalType *pLVar7;
  pointer pEVar8;
  pointer this_01;
  BinderException *pBVar9;
  string *psVar10;
  ulong __n;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *in_stack_00000008;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a0;
  ColumnBinding local_198;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_188;
  Expression *local_180;
  UpdateSetInfo *local_178;
  undefined1 local_170 [8];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_expressions;
  UpdateBinder binder;
  idx_t proj_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_178 = set_info;
  pp_Var4 = (_func_int **)GenerateTableIndex((Binder *)op);
  projection_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  projection_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  projection_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = 0;
  proj_index = (idx_t)pp_Var4;
  while( true ) {
    if ((ulong)((long)(*(long *)&(table->super_StandardEntry).super_InCatalogEntry.
                                 super_CatalogEntry.type -
                      (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid) >> 5
               ) <= __n) {
      if ((*(char *)&root[1].
                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == 'f')
         || (projection_expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             projection_expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
        make_uniq<duckdb::LogicalProjection,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                  ((duckdb *)&binder,&proj_index,&projection_expressions);
        this_01 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&binder);
        local_188._M_head_impl =
             *(LogicalOperator **)
              &(local_178->condition).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>;
        (local_178->condition).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
             (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
        LogicalOperator::AddChild
                  (&this_01->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_188);
        if (local_188._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)((BaseExpression *)&(local_188._M_head_impl)->_vptr_LogicalOperator)->
                             _vptr_BaseExpression + 8))();
        }
        local_188._M_head_impl = (LogicalOperator *)0x0;
        (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)binder.super_ExpressionBinder._vptr_ExpressionBinder;
      }
      else {
        (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_178->condition).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>;
        (local_178->condition).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
             (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&projection_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               );
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             this;
    }
    name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid,
                       __n);
    result_type.ptr =
         (LogicalType *)
         vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
         ::get<true>((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)&(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name,
                     __n);
    bVar3 = TableCatalogEntry::ColumnExists((TableCatalogEntry *)columns,name);
    if (!bVar3) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,"Referenced update column %s not found in table!",
                 (allocator *)&local_198);
      ::std::__cxx11::string::string((string *)&local_50,(string *)name);
      BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&binder,&local_50);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = TableCatalogEntry::GetColumn((TableCatalogEntry *)columns,name);
    bVar3 = ColumnDefinition::Generated(this_00);
    if (bVar3) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,"Cant update column \"%s\" because it is a generated column!",
                 (allocator *)&local_198);
      psVar10 = ColumnDefinition::Name_abi_cxx11_(this_00);
      ::std::__cxx11::string::string((string *)&local_70,(string *)psVar10);
      BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&binder,&local_70);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar1 = (in_stack_00000008->
             super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (in_stack_00000008->
             super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    binder.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)ColumnDefinition::Physical(this_00);
    _Var5 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<duckdb::PhysicalIndex*,std::vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::PhysicalIndex_const>>
                      (pPVar1,pPVar2,&binder);
    if (_Var5._M_current !=
        (in_stack_00000008->
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    binder.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)ColumnDefinition::Physical(this_00);
    ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
    emplace_back<duckdb::PhysicalIndex>(in_stack_00000008,(PhysicalIndex *)&binder);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)result_type.ptr);
    if ((pPVar6->super_BaseExpression).type == VALUE_DEFAULT) {
      pLVar7 = ColumnDefinition::Type(this_00);
      make_uniq<duckdb::BoundDefaultExpression,duckdb::LogicalType_const&>
                ((duckdb *)&local_198,pLVar7);
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)local_198.table_index;
      local_198.table_index = 0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)(root + 5),
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &binder);
      if (binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0) {
        (**(code **)(*binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
      }
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
      if ((_func_int **)local_198.table_index != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_198.table_index + 8))();
      }
    }
    else {
      UpdateBinder::UpdateBinder
                (&binder,(Binder *)op,
                 (ClientContext *)
                 (op->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pLVar7 = ColumnDefinition::Type(this_00);
      LogicalType::operator=(&binder.super_ExpressionBinder.target_type,pLVar7);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_170,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&binder,result_type,false);
      PlanSubqueries((Binder *)op,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_170,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)local_178);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_170);
      local_198.column_index =
           (long)projection_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)projection_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_198.table_index = (idx_t)pp_Var4;
      make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_180,&pEVar8->return_type,&local_198);
      local_1a0._M_head_impl = local_180;
      local_180 = (Expression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)(root + 5),
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_1a0);
      if (local_1a0._M_head_impl != (Expression *)0x0) {
        (*((local_1a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_1a0._M_head_impl = (Expression *)0x0;
      if (local_180 != (Expression *)0x0) {
        (*(local_180->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&projection_expressions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_170);
      if (local_170 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_170)->_vptr_BaseExpression[1])();
      }
      ExpressionBinder::~ExpressionBinder(&binder.super_ExpressionBinder);
    }
    __n = __n + 1;
  }
  pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&binder,"Multiple assignments to same column \"%s\"",(allocator *)&local_198)
  ;
  ::std::__cxx11::string::string((string *)&local_90,(string *)name);
  BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&binder,&local_90);
  __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<LogicalOperator> Binder::BindUpdateSet(LogicalOperator &op, unique_ptr<LogicalOperator> root,
                                                  UpdateSetInfo &set_info, TableCatalogEntry &table,
                                                  vector<PhysicalIndex> &columns) {
	auto proj_index = GenerateTableIndex();

	vector<unique_ptr<Expression>> projection_expressions;
	D_ASSERT(set_info.columns.size() == set_info.expressions.size());
	for (idx_t i = 0; i < set_info.columns.size(); i++) {
		auto &colname = set_info.columns[i];
		auto &expr = set_info.expressions[i];
		if (!table.ColumnExists(colname)) {
			throw BinderException("Referenced update column %s not found in table!", colname);
		}
		auto &column = table.GetColumn(colname);
		if (column.Generated()) {
			throw BinderException("Cant update column \"%s\" because it is a generated column!", column.Name());
		}
		if (std::find(columns.begin(), columns.end(), column.Physical()) != columns.end()) {
			throw BinderException("Multiple assignments to same column \"%s\"", colname);
		}
		columns.push_back(column.Physical());
		if (expr->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
			op.expressions.push_back(make_uniq<BoundDefaultExpression>(column.Type()));
		} else {
			UpdateBinder binder(*this, context);
			binder.target_type = column.Type();
			auto bound_expr = binder.Bind(expr);
			PlanSubqueries(bound_expr, root);

			op.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    bound_expr->return_type, ColumnBinding(proj_index, projection_expressions.size())));
			projection_expressions.push_back(std::move(bound_expr));
		}
	}
	if (op.type != LogicalOperatorType::LOGICAL_UPDATE && projection_expressions.empty()) {
		return root;
	}
	// now create the projection
	auto proj = make_uniq<LogicalProjection>(proj_index, std::move(projection_expressions));
	proj->AddChild(std::move(root));
	return unique_ptr_cast<LogicalProjection, LogicalOperator>(std::move(proj));
}